

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall kj::anon_unknown_59::InMemoryFile::~InMemoryFile(InMemoryFile *this)

{
  Array<unsigned_char>::~Array(&(this->impl).value.bytes);
  _::Mutex::~Mutex(&(this->impl).mutex);
  AtomicRefcounted::~AtomicRefcounted(&this->super_AtomicRefcounted);
  return;
}

Assistant:

InMemoryFile(const Clock& clock): impl(clock) {}